

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection.hpp
# Opt level: O3

void __thiscall
websocketpp::transport::asio::connection<websocketpp::config::asio::transport_config>::
async_read_at_least(connection<websocketpp::config::asio::transport_config> *this,size_t num_bytes,
                   char *buf,size_t len,read_handler *handler)

{
  basic<websocketpp::concurrency::basic,_websocketpp::log::alevel> *this_00;
  element_type *peVar1;
  element_type *peVar2;
  undefined8 uVar3;
  _Any_data _Var4;
  size_t __n;
  _Any_data _Var5;
  stringstream s;
  undefined1 local_2d8 [40];
  handler_allocator *local_2b0;
  __weak_count<(__gnu_cxx::_Lock_policy)2> local_2a8;
  undefined1 auStack_2a0 [8];
  undefined1 local_298 [24];
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_280;
  __shared_ptr<websocketpp::log::basic<websocketpp::concurrency::basic,_websocketpp::log::alevel>,_(__gnu_cxx::_Lock_policy)2>
  local_278;
  strand_service *local_268;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_260;
  undefined1 local_258 [24];
  _Any_data local_240;
  __shared_ptr<websocketpp::log::basic<websocketpp::concurrency::basic,_websocketpp::log::alevel>,_(__gnu_cxx::_Lock_policy)2>
  local_230;
  __shared_ptr<websocketpp::log::basic<websocketpp::concurrency::basic,_websocketpp::log::alevel>,_(__gnu_cxx::_Lock_policy)2>
  local_220;
  __weak_count<(__gnu_cxx::_Lock_policy)2> local_208;
  pointer pcStack_200;
  _Any_data local_1f8;
  code *local_1e8;
  _Any_data local_1d8;
  error_code local_1c8;
  _Any_data local_1b8;
  _Any_data local_1a8;
  undefined1 local_198 [360];
  
  if ((((this->m_alog).
        super___shared_ptr<websocketpp::log::basic<websocketpp::concurrency::basic,_websocketpp::log::alevel>,_(__gnu_cxx::_Lock_policy)2>
       ._M_ptr)->m_static_channels & 0x400) != 0) {
    __n = len;
    std::__cxx11::stringstream::stringstream((stringstream *)local_1b8._M_pod_data);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8._M_pod_data,"asio async_read_at_least: ",0x1a);
    std::ostream::_M_insert<unsigned_long>((ulong)&local_1a8);
    this_00 = (this->m_alog).
              super___shared_ptr<websocketpp::log::basic<websocketpp::concurrency::basic,_websocketpp::log::alevel>,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr;
    std::__cxx11::stringbuf::str();
    log::basic<websocketpp::concurrency::basic,_websocketpp::log::alevel>::write
              (this_00,0x400,&local_268,__n);
    if (local_268 != (strand_service *)local_258) {
      operator_delete(local_268);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8._M_pod_data);
    std::ios_base::~ios_base((ios_base *)(local_198 + 0x60));
  }
  peVar1 = (this->super_socket_con_type).m_socket.
           super___shared_ptr<asio::basic_stream_socket<asio::ip::tcp>,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  peVar2 = (this->m_strand).super___shared_ptr<asio::io_context::strand,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  local_2d8._16_8_ = num_bytes;
  local_2d8._24_8_ = buf;
  local_2d8._32_8_ = len;
  get_shared((connection<websocketpp::config::asio::transport_config> *)local_2d8);
  local_208._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)handle_async_read;
  pcStack_200 = (pointer)0x0;
  std::function<void_(const_std::error_code_&,_unsigned_long)>::function
            ((function<void_(const_std::error_code_&,_unsigned_long)> *)&local_1f8,handler);
  local_1d8._M_unused._M_member_pointer = local_2d8._0_8_;
  local_1d8._8_8_ = local_2d8._8_8_;
  local_2d8._0_16_ = ZEXT816(0) << 0x20;
  local_1b8._M_unused._M_object = local_208._M_pi;
  local_1b8._8_8_ = pcStack_200;
  std::
  _Tuple_impl<0UL,_std::shared_ptr<websocketpp::transport::asio::connection<websocketpp::config::asio::transport_config>_>,_std::function<void_(const_std::error_code_&,_unsigned_long)>,_std::_Placeholder<1>,_std::_Placeholder<2>_>
  ::_Tuple_impl((_Tuple_impl<0UL,_std::shared_ptr<websocketpp::transport::asio::connection<websocketpp::config::asio::transport_config>_>,_std::function<void_(const_std::error_code_&,_unsigned_long)>,_std::_Placeholder<1>,_std::_Placeholder<2>_>
                 *)&local_1a8,
                (_Tuple_impl<0UL,_std::shared_ptr<websocketpp::transport::asio::connection<websocketpp::config::asio::transport_config>_>,_std::function<void_(const_std::error_code_&,_unsigned_long)>,_std::_Placeholder<1>,_std::_Placeholder<2>_>
                 *)&local_1f8);
  local_2b0 = &this->m_read_handler_allocator;
  local_2a8._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1b8._M_unused._0_8_;
  auStack_2a0 = (undefined1  [8])local_1b8._8_8_;
  std::
  _Tuple_impl<0UL,_std::shared_ptr<websocketpp::transport::asio::connection<websocketpp::config::asio::transport_config>_>,_std::function<void_(const_std::error_code_&,_unsigned_long)>,_std::_Placeholder<1>,_std::_Placeholder<2>_>
  ::_Tuple_impl((_Tuple_impl<0UL,_std::shared_ptr<websocketpp::transport::asio::connection<websocketpp::config::asio::transport_config>_>,_std::function<void_(const_std::error_code_&,_unsigned_long)>,_std::_Placeholder<1>,_std::_Placeholder<2>_>
                 *)local_298,
                (_Tuple_impl<0UL,_std::shared_ptr<websocketpp::transport::asio::connection<websocketpp::config::asio::transport_config>_>,_std::function<void_(const_std::error_code_&,_unsigned_long)>,_std::_Placeholder<1>,_std::_Placeholder<2>_>
                 *)&local_1a8);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_198._24_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_198._24_8_);
  }
  if ((code *)local_198._0_8_ != (code *)0x0) {
    (*(code *)local_198._0_8_)(&local_1a8,&local_1a8,3);
  }
  local_268 = peVar2->service_;
  _Stack_260._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar2->impl_;
  local_230._M_refcount._M_pi = _Stack_280._M_pi;
  uVar3 = local_298._16_8_;
  _Var5 = (_Any_data)(ZEXT816(0) << 0x20);
  local_258._0_8_ = local_2b0;
  local_258._8_8_ = local_2a8._M_pi;
  local_258._16_8_ = auStack_2a0;
  local_230._M_ptr = (element_type *)0x0;
  _Var4 = stack0xfffffffffffffd78;
  local_240 = _Var5;
  if ((element_type *)local_298._16_8_ != (element_type *)0x0) {
    local_240._8_8_ = local_298._8_8_;
    local_240._M_unused._M_object = (void *)local_298._0_8_;
    _Var4 = _Var5;
    local_230._M_ptr = (element_type *)local_298._16_8_;
  }
  stack0xfffffffffffffd78 = _Var4;
  local_1b8._M_unused._M_object = (void *)local_2d8._16_8_;
  local_1a8._M_unused._M_object = (void *)local_2d8._24_8_;
  local_1a8._8_8_ = local_2d8._32_8_;
  local_198._0_8_ = 0;
  local_198._8_4_ = 0;
  local_198._32_8_ = local_2b0;
  local_198._40_8_ = local_2a8._M_pi;
  local_198._48_8_ = auStack_2a0;
  local_198._72_8_ = (element_type *)0x0;
  local_198._80_8_ = local_230._M_refcount._M_pi;
  local_220 = (__shared_ptr<websocketpp::log::basic<websocketpp::concurrency::basic,_websocketpp::log::alevel>,_(__gnu_cxx::_Lock_policy)2>
               )_Var5;
  local_198._56_16_ = (undefined1  [16])_Var5;
  if ((element_type *)uVar3 != (element_type *)0x0) {
    local_198._56_16_ = (undefined1  [16])local_240;
    local_220 = (__shared_ptr<websocketpp::log::basic<websocketpp::concurrency::basic,_websocketpp::log::alevel>,_(__gnu_cxx::_Lock_policy)2>
                 )(ZEXT816(0) << 0x20);
    local_198._72_8_ = uVar3;
    local_230 = local_220;
  }
  local_198._88_8_ = local_278._M_ptr;
  local_198._96_8_ = local_278._M_refcount._M_pi;
  local_1c8._M_value = 0;
  local_278 = (__shared_ptr<websocketpp::log::basic<websocketpp::concurrency::basic,_websocketpp::log::alevel>,_(__gnu_cxx::_Lock_policy)2>
               )_Var5;
  local_1b8._8_8_ = peVar1;
  local_198._16_8_ = local_268;
  local_198._24_8_ = _Stack_260._M_pi;
  local_1c8._M_cat = (error_category *)std::_V2::system_category();
  ::asio::detail::
  read_op<asio::basic_stream_socket<asio::ip::tcp>,_asio::mutable_buffers_1,_const_asio::mutable_buffer_*,_asio::detail::transfer_at_least_t,_asio::detail::wrapped_handler<asio::io_context::strand,_websocketpp::transport::asio::custom_alloc_handler<std::_Bind<void_(websocketpp::transport::asio::connection<websocketpp::config::asio::transport_config>::*(std::shared_ptr<websocketpp::transport::asio::connection<websocketpp::config::asio::transport_config>_>,_std::function<void_(const_std::error_code_&,_unsigned_long)>,_std::_Placeholder<1>,_std::_Placeholder<2>))(std::function<void_(const_std::error_code_&,_unsigned_long)>,_const_std::error_code_&,_unsigned_long)>_>,_asio::detail::is_continuation_if_running>_>
  ::operator()((read_op<asio::basic_stream_socket<asio::ip::tcp>,_asio::mutable_buffers_1,_const_asio::mutable_buffer_*,_asio::detail::transfer_at_least_t,_asio::detail::wrapped_handler<asio::io_context::strand,_websocketpp::transport::asio::custom_alloc_handler<std::_Bind<void_(websocketpp::transport::asio::connection<websocketpp::config::asio::transport_config>::*(std::shared_ptr<websocketpp::transport::asio::connection<websocketpp::config::asio::transport_config>_>,_std::function<void_(const_std::error_code_&,_unsigned_long)>,_std::_Placeholder<1>,_std::_Placeholder<2>))(std::function<void_(const_std::error_code_&,_unsigned_long)>,_const_std::error_code_&,_unsigned_long)>_>,_asio::detail::is_continuation_if_running>_>
                *)&local_1b8,&local_1c8,0,1);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_198._96_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_198._96_8_);
  }
  if ((element_type *)local_198._72_8_ != (element_type *)0x0) {
    (*(code *)local_198._72_8_)(local_198 + 0x38,local_198 + 0x38,3);
  }
  if (local_220._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_220._M_refcount._M_pi);
  }
  if (local_230._M_ptr != (element_type *)0x0) {
    (*(code *)local_230._M_ptr)(&local_240,&local_240,3);
  }
  if (local_278._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_278._M_refcount._M_pi);
  }
  if ((element_type *)local_298._16_8_ != (element_type *)0x0) {
    (*(code *)local_298._16_8_)
              ((_Tuple_impl<0UL,_std::shared_ptr<websocketpp::transport::asio::connection<websocketpp::config::asio::transport_config>_>,_std::function<void_(const_std::error_code_&,_unsigned_long)>,_std::_Placeholder<1>,_std::_Placeholder<2>_>
                *)local_298,
               (_Tuple_impl<0UL,_std::shared_ptr<websocketpp::transport::asio::connection<websocketpp::config::asio::transport_config>_>,_std::function<void_(const_std::error_code_&,_unsigned_long)>,_std::_Placeholder<1>,_std::_Placeholder<2>_>
                *)local_298,3);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1d8._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1d8._8_8_);
  }
  if ((strand_impl *)local_1e8 != (strand_impl *)0x0) {
    (*local_1e8)(&local_1f8,&local_1f8,__destroy_functor);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2d8._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2d8._8_8_);
  }
  return;
}

Assistant:

void async_read_at_least(size_t num_bytes, char *buf, size_t len,
        read_handler handler)
    {
        if (m_alog->static_test(log::alevel::devel)) {
            std::stringstream s;
            s << "asio async_read_at_least: " << num_bytes;
            m_alog->write(log::alevel::devel,s.str());
        }

        // TODO: safety vs speed ?
        // maybe move into an if devel block
        /*if (num_bytes > len) {
            m_elog->write(log::elevel::devel,
                "asio async_read_at_least error::invalid_num_bytes");
            handler(make_error_code(transport::error::invalid_num_bytes),
                size_t(0));
            return;
        }*/

        if (config::enable_multithreading) {
            lib::asio::async_read(
                socket_con_type::get_socket(),
                lib::asio::buffer(buf,len),
                lib::asio::transfer_at_least(num_bytes),
                m_strand->wrap(make_custom_alloc_handler(
                    m_read_handler_allocator,
                    lib::bind(
                        &type::handle_async_read, get_shared(),
                        handler,
                        lib::placeholders::_1, lib::placeholders::_2
                    )
                ))
            );
        } else {
            lib::asio::async_read(
                socket_con_type::get_socket(),
                lib::asio::buffer(buf,len),
                lib::asio::transfer_at_least(num_bytes),
                make_custom_alloc_handler(
                    m_read_handler_allocator,
                    lib::bind(
                        &type::handle_async_read, get_shared(),
                        handler,
                        lib::placeholders::_1, lib::placeholders::_2
                    )
                )
            );    
        }
        
    }